

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
CGL::HDRImageBuffer::toColor
          (HDRImageBuffer *this,ImageBuffer *target,size_t x0,size_t y0,size_t x1,size_t y1)

{
  pointer pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t y;
  size_t x;
  size_t x_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar7 [64];
  Color local_78;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  undefined1 extraout_var [56];
  
  lVar6 = y0 << 5;
  local_68._8_8_ = 0x3ff0000000000000;
  local_68._0_8_ = 0x3ff0000000000000;
  while( true ) {
    x_00 = x0;
    uVar4 = x0 << 5 | 0x10;
    if (y1 <= y0) break;
    for (; x_00 < x1; x_00 = x_00 + 1) {
      lVar5 = this->w * lVar6;
      pVVar1 = (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48 = pow(*(double *)((long)pVVar1 + (uVar4 - 0x10) + lVar5) * 1.4142135381698608,
                     0.45454543828964233);
      uStack_40 = extraout_XMM0_Qb;
      local_58 = pow(*(double *)((long)pVVar1 + (uVar4 - 8) + lVar5) * 1.4142135381698608,
                     0.45454543828964233);
      uStack_50 = extraout_XMM0_Qb_00;
      auVar7._0_8_ = pow(*(double *)((long)&pVVar1->field_0 + uVar4 + lVar5) * 1.4142135381698608,
                         0.45454543828964233);
      auVar7._8_56_ = extraout_var;
      auVar2 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar7._0_16_);
      auVar2 = vmaxsd_avx(auVar2,ZEXT816(0));
      local_78.b = (float)auVar2._0_8_;
      auVar3._8_8_ = uStack_40;
      auVar3._0_8_ = local_48;
      auVar2._8_8_ = uStack_50;
      auVar2._0_8_ = local_58;
      auVar2 = vunpcklpd_avx(auVar3,auVar2);
      auVar2 = vminpd_avx(local_68,auVar2);
      auVar2 = vmaxpd_avx(auVar2,_DAT_001150a0);
      auVar2 = vcvtpd2ps_avx(auVar2);
      local_78._0_8_ = vmovlpd_avx(auVar2);
      ImageBuffer::update_pixel(target,&local_78,x_00,y0);
      uVar4 = uVar4 + 0x20;
    }
    y0 = y0 + 1;
    lVar6 = lVar6 + 0x20;
  }
  return;
}

Assistant:

void toColor(ImageBuffer& target, size_t x0, size_t y0, size_t x1, size_t y1) {

    float gamma = 2.2f;
    float level = 1.0f;
    float one_over_gamma = 1.0f / gamma;
    float exposure = sqrt(pow(2,level));
    for (size_t y = y0; y < y1; ++y) {
      for (size_t x = x0; x < x1; ++x) {
        const Vector3D& s = data[x + y * w];
        float r = std::max(0.0, std::min(pow(s.r * exposure, one_over_gamma), 1.0));
        float g = std::max(0.0, std::min(pow(s.g * exposure, one_over_gamma), 1.0));
        float b = std::max(0.0, std::min(pow(s.b * exposure, one_over_gamma), 1.0));
        target.update_pixel(Color(r, g, b), x, y);
      }
    }
  }